

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

bool __thiscall
ON_SN_BLOCK::IsValidBlock
          (ON_SN_BLOCK *this,ON_TextLog *textlog,SN_ELEMENT ***hash_table,
          ON__UINT32 hash_block_count,ON__UINT64 *active_id_count)

{
  ulong uVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  SN_ELEMENT *local_70;
  SN_ELEMENT *e;
  long lStack_60;
  ON__UINT32 id_crc32;
  size_t aidcnt;
  size_t pc;
  size_t i;
  ON__UINT64 sn;
  ON__UINT64 sn0;
  ON__UINT64 *active_id_count_local;
  ON__UINT32 hash_block_count_local;
  SN_ELEMENT ***hash_table_local;
  ON_TextLog *textlog_local;
  ON_SN_BLOCK *this_local;
  
  if (this->m_count < 0x2001) {
    if (this->m_count < this->m_purged) {
      if (textlog != (ON_TextLog *)0x0) {
        ON_TextLog::Print(textlog,"ON_SN_BLOCK m_purged = %u (should be >0 and <=%u).\n",
                          (ulong)this->m_purged,(ulong)this->m_count);
      }
      this_local._7_1_ = ON_SerialNumberMap_IsNotValidBlock();
    }
    else if ((this->m_count < 2) && (this->m_sorted != 1)) {
      if (textlog != (ON_TextLog *)0x0) {
        ON_TextLog::Print(textlog,"ON_SN_BLOCK m_count = %u but m_sorted is not 1.\n",
                          (ulong)this->m_count);
      }
      this_local._7_1_ = ON_SerialNumberMap_IsNotValidBlock();
    }
    else if (this->m_count == 0) {
      if (this->m_sn0 == 0) {
        if (this->m_sn1 == 0) {
          this_local._7_1_ = true;
        }
        else {
          if (textlog != (ON_TextLog *)0x0) {
            ON_TextLog::Print(textlog,"ON_SN_BLOCK m_count = 0 but m_sn1 != 0.\n");
          }
          this_local._7_1_ = ON_SerialNumberMap_IsNotValidBlock();
        }
      }
      else {
        if (textlog != (ON_TextLog *)0x0) {
          ON_TextLog::Print(textlog,"ON_SN_BLOCK m_count = 0 but m_sn0 != 0.\n");
        }
        this_local._7_1_ = ON_SerialNumberMap_IsNotValidBlock();
      }
    }
    else if (this->m_sn1 < this->m_sn0) {
      if (textlog != (ON_TextLog *)0x0) {
        ON_TextLog::Print(textlog,"ON_SN_BLOCK m_sn1 < m_sn0.\n");
      }
      this_local._7_1_ = ON_SerialNumberMap_IsNotValidBlock();
    }
    else if ((this->m_purged < this->m_count) &&
            (this->m_sn1 - this->m_sn0 < (ulong)((this->m_count - this->m_purged) - 1))) {
      if (textlog != (ON_TextLog *)0x0) {
        ON_TextLog::Print(textlog,"ON_SN_BLOCK m_sn1 < m_sn0.\n");
      }
      this_local._7_1_ = ON_SerialNumberMap_IsNotValidBlock();
    }
    else {
      sn = 0;
      aidcnt = 0;
      lStack_60 = 0;
      for (pc = 0; pc < this->m_count; pc = pc + 1) {
        if (this->m_sn[pc].m_sn_active == '\0') {
          aidcnt = aidcnt + 1;
          if (this->m_sn[pc].m_id_active != '\0') {
            if (textlog != (ON_TextLog *)0x0) {
              ON_TextLog::Print(textlog,
                                "ON_SN_BLOCK m_sn[%d].m_sn_active = 0 but m_id_active != 0.\n",pc);
            }
            bVar2 = ON_SerialNumberMap_IsNotValidBlock();
            return bVar2;
          }
        }
        else if (this->m_sn[pc].m_id_active != '\0') {
          lStack_60 = lStack_60 + 1;
          bVar2 = IdIsNotNil(&this->m_sn[pc].m_id);
          if (!bVar2) {
            if (textlog != (ON_TextLog *)0x0) {
              ON_TextLog::Print(textlog,"ON_SN_BLOCK m_sn[%d].m_id_active != 0 but m_id = 0.\n",pc);
            }
            bVar2 = ON_SerialNumberMap_IsNotValidBlock();
            return bVar2;
          }
          OVar3 = IdCRC32(&this->m_sn[pc].m_id);
          if (OVar3 != this->m_sn[pc].m_id_crc32) {
            if (textlog != (ON_TextLog *)0x0) {
              ON_TextLog::Print(textlog,
                                "ON_SN_BLOCK m_sn[%d].m_id_active != 0 and m_sn[i].m_id_crc32 != IdCRC32(&m_sn[i].m_id).\n"
                                ,pc);
            }
            bVar2 = ON_SerialNumberMap_IsNotValidBlock();
            return bVar2;
          }
          if (hash_table != (SN_ELEMENT ***)0x0) {
            for (local_70 = hash_table[(ulong)OVar3 % (ulong)hash_block_count]
                            [((ulong)OVar3 / 0xffa) % 0xffa];
                (local_70 != (SN_ELEMENT *)0x0 && (local_70 != this->m_sn + pc));
                local_70 = local_70->m_next) {
            }
            if (local_70 == (SN_ELEMENT *)0x0) {
              if (textlog != (ON_TextLog *)0x0) {
                ON_TextLog::Print(textlog,
                                  "ON_SN_BLOCK m_sn[%d].m_id_active != 0 but the element is not in m_hash_table[].\n"
                                  ,pc);
              }
              bVar2 = ON_SerialNumberMap_IsNotValidBlock();
              return bVar2;
            }
          }
        }
        uVar1 = this->m_sn[pc].m_sn;
        if (uVar1 < this->m_sn0) {
          if (textlog != (ON_TextLog *)0x0) {
            ON_TextLog::Print(textlog,"ON_SN_BLOCK m_sn[%d] < m_sn0.\n",pc);
          }
          bVar2 = ON_SerialNumberMap_IsNotValidBlock();
          return bVar2;
        }
        if (this->m_sn1 < uVar1) {
          if (textlog != (ON_TextLog *)0x0) {
            ON_TextLog::Print(textlog,"ON_SN_BLOCK m_sn[%d] > m_sn1.\n",pc);
          }
          bVar2 = ON_SerialNumberMap_IsNotValidBlock();
          return bVar2;
        }
        if ((this->m_sorted != 0) && (bVar2 = uVar1 <= sn, sn = uVar1, bVar2)) {
          if (textlog != (ON_TextLog *)0x0) {
            ON_TextLog::Print(textlog,"ON_SN_BLOCK m_sn[%d] > m_sn[%d].\n",pc,pc - 1);
          }
          bVar2 = ON_SerialNumberMap_IsNotValidBlock();
          return bVar2;
        }
      }
      if (aidcnt == this->m_purged) {
        if (active_id_count != (ON__UINT64 *)0x0) {
          *active_id_count = lStack_60 + *active_id_count;
        }
        this_local._7_1_ = true;
      }
      else {
        if (textlog != (ON_TextLog *)0x0) {
          ON_TextLog::Print(textlog,"ON_SN_BLOCK m_purged = %u (should be %u)\n",
                            (ulong)this->m_purged,aidcnt);
        }
        this_local._7_1_ = ON_SerialNumberMap_IsNotValidBlock();
      }
    }
  }
  else {
    if (textlog != (ON_TextLog *)0x0) {
      ON_TextLog::Print(textlog,"ON_SN_BLOCK m_count = %u (should be >=0 and <%u).\n",
                        (ulong)this->m_count,0x2000);
    }
    this_local._7_1_ = ON_SerialNumberMap_IsNotValidBlock();
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SN_BLOCK::IsValidBlock(
  ON_TextLog* textlog, 
  struct ON_SerialNumberMap::SN_ELEMENT*const*const* hash_table,
  ON__UINT32 hash_block_count,
  ON__UINT64* active_id_count
  ) const
{
  ON__UINT64 sn0, sn;
  size_t i, pc, aidcnt;

  if ( m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_count = %u (should be >=0 and <%u).\n",
                      m_count,ON_SN_BLOCK::SN_BLOCK_CAPACITY);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( m_purged > m_count )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_purged = %u (should be >0 and <=%u).\n",
                      m_purged,m_count);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( m_count < 2 && 1 != m_sorted )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_count = %u but m_sorted is not 1.\n",m_count);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( 0 == m_count )
  {
    if ( 0 != m_sn0 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_count = 0 but m_sn0 != 0.\n");
      return ON_SerialNumberMap_IsNotValidBlock();
    }
    if ( 0 != m_sn1 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_count = 0 but m_sn1 != 0.\n");
      return ON_SerialNumberMap_IsNotValidBlock();
    }
    return true;
  }

  if ( m_sn1 < m_sn0 )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_sn1 < m_sn0.\n");
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( m_count > m_purged )
  {
    if ( m_sn1 - m_sn0 < m_count-m_purged-1 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_sn1 < m_sn0.\n");
      return ON_SerialNumberMap_IsNotValidBlock();
    }
  }

  sn0 = 0;
  pc = 0;
  aidcnt = 0;
  for (i = 0; i < m_count; i++)
  {
    // validate m_sn_active and m_id_active flags
    if (0 == m_sn[i].m_sn_active)
    {
      // The element serial number is not active.
      // The id must also be not active.
      pc++;
      if ( 0 != m_sn[i].m_id_active )
      {
        if (textlog)
          textlog->Print("ON_SN_BLOCK m_sn[%d].m_sn_active = 0 but m_id_active != 0.\n",i);
        return ON_SerialNumberMap_IsNotValidBlock();
      }
    }
    else if ( 0 != m_sn[i].m_id_active )
    {
      // The element has active serial number and active id.
      // It must have a nonzero m_id and be in the hash table.
      aidcnt++;
      if ( IdIsNotNil(&m_sn[i].m_id) )
      {
        const ON__UINT32 id_crc32 = IdCRC32(&m_sn[i].m_id);
        if (id_crc32 != m_sn[i].m_id_crc32)
        {
          if (textlog)
            textlog->Print("ON_SN_BLOCK m_sn[%d].m_id_active != 0 and m_sn[i].m_id_crc32 != IdCRC32(&m_sn[i].m_id).\n", i);
          return ON_SerialNumberMap_IsNotValidBlock();
        }
        if (nullptr != hash_table)
        {
          const ON_SerialNumberMap::SN_ELEMENT* e = nullptr;
          for (e = hash_table[id_crc32 % hash_block_count][(id_crc32/ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY) % ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY]; 0 != e; e = e->m_next)
          {
            if (e == &m_sn[i])
            {
              // found m_sn[i] in the hash table
              break;
            }
          }
          if (nullptr == e)
          {
            // m_sn[i] is not in the hash table but m_id_active indicates
            // it should be.
            if (textlog)
              textlog->Print("ON_SN_BLOCK m_sn[%d].m_id_active != 0 but the element is not in m_hash_table[].\n", i);
            return ON_SerialNumberMap_IsNotValidBlock();
          }
        }
      }
      else 
      {
        if (textlog)
          textlog->Print("ON_SN_BLOCK m_sn[%d].m_id_active != 0 but m_id = 0.\n",i);
        return ON_SerialNumberMap_IsNotValidBlock();
      }
    }

    // verify the serial number is in the range m_sn0 to m_sn1
    sn = m_sn[i].m_sn;
    if ( sn < m_sn0 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_sn[%d] < m_sn0.\n",i);
      return ON_SerialNumberMap_IsNotValidBlock();
    }
    if ( sn > m_sn1 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_sn[%d] > m_sn1.\n",i);
      return ON_SerialNumberMap_IsNotValidBlock();
    }

    if ( m_sorted )
    {
      // Verify this sn is bigger than the previous one
      if (sn <= sn0 )
      {
        if (textlog)
          textlog->Print("ON_SN_BLOCK m_sn[%d] > m_sn[%d].\n",i,i-1);
        return ON_SerialNumberMap_IsNotValidBlock();
      }
      sn0 = sn;
    }
  }

  if ( pc != m_purged )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_purged = %u (should be %u)\n",m_purged,pc);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  // Update the active id count to include
  // the active ids from this block.
  if ( 0 != active_id_count )
    *active_id_count += aidcnt;

  return true;
}